

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketHeader.cpp
# Opt level: O0

void __thiscall ki::protocol::net::PacketHeader::read_from(PacketHeader *this,istream *istream)

{
  uint8_t uVar1;
  int iVar2;
  ulong uVar3;
  parse_error *ppVar4;
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  istream *local_18;
  istream *istream_local;
  PacketHeader *this_local;
  
  local_18 = istream;
  istream_local = (istream *)this;
  iVar2 = std::istream::get();
  this->m_control = 0 < iVar2;
  uVar3 = std::ios::fail();
  if ((uVar3 & 1) != 0) {
    local_4d = 1;
    ppVar4 = (parse_error *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"Not enough data was available to read packet header. (m_control)",&local_39
              );
    parse_error::parse_error(ppVar4,(string *)local_38,INVALID_HEADER_DATA);
    local_4d = 0;
    __cxa_throw(ppVar4,&parse_error::typeinfo,parse_error::~parse_error);
  }
  uVar1 = std::istream::get();
  this->m_opcode = uVar1;
  uVar3 = std::ios::fail();
  if ((uVar3 & 1) == 0) {
    std::istream::ignore((long)local_18);
    uVar3 = std::ios::eof();
    if ((uVar3 & 1) == 0) {
      return;
    }
    ppVar4 = (parse_error *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"Not enough data was available to read packet header. (ignored bytes)",
               &local_99);
    parse_error::parse_error(ppVar4,(string *)local_98,INVALID_HEADER_DATA);
    __cxa_throw(ppVar4,&parse_error::typeinfo,parse_error::~parse_error);
  }
  local_72 = 1;
  ppVar4 = (parse_error *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"Not enough data was available to read packet header. (m_opcode)",&local_71);
  parse_error::parse_error(ppVar4,(string *)local_70,INVALID_HEADER_DATA);
  local_72 = 0;
  __cxa_throw(ppVar4,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void PacketHeader::read_from(std::istream& istream)
	{
		m_control = istream.get() >= 1;
		if (istream.fail())
			throw parse_error("Not enough data was available to read packet header. (m_control)",
				parse_error::INVALID_HEADER_DATA);
		m_opcode = istream.get();
		if (istream.fail())
			throw parse_error("Not enough data was available to read packet header. (m_opcode)",
				parse_error::INVALID_HEADER_DATA);
		istream.ignore(2);
		if (istream.eof())
			throw parse_error("Not enough data was available to read packet header. (ignored bytes)",
				parse_error::INVALID_HEADER_DATA);
	}